

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_basics.cpp
# Opt level: O2

void test_1d_static<1ul>(void)

{
  int local_4c;
  int *local_48;
  int dptr [1];
  int *local_38;
  
  local_48 = (int *)CONCAT71(local_48._1_7_,1);
  local_38 = (int *)CONCAT71(local_38._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x1d,"void test_1d_static() [X = 1UL]",(bool *)&local_48,(bool *)&local_38);
  local_48 = (int *)0x1;
  local_38 = (int *)CONCAT44(local_38._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x1f,"void test_1d_static() [X = 1UL]",(unsigned_long *)&local_48,(int *)&local_38);
  local_48 = (int *)0x1;
  local_38 = (int *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x21,"void test_1d_static() [X = 1UL]",(unsigned_long *)&local_48,
             (unsigned_long *)&local_38);
  local_48 = (int *)0x1;
  local_38 = (int *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x22,"void test_1d_static() [X = 1UL]",(unsigned_long *)&local_48,
             (unsigned_long *)&local_38);
  for (local_4c = 0; local_4c == 0; local_4c = local_4c + 1) {
    local_48 = (int *)0x0;
    boost::detail::test_eq_impl<unsigned_long,int>
              ("(l.index(i))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x29,"void test_1d_static() [X = 1UL]",(unsigned_long *)&local_48,&local_4c);
    local_48 = dptr + local_4c;
    local_38 = local_48;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i)])","&(dptr[i])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x2b,"void test_1d_static() [X = 1UL]",&local_48,&local_38);
    dptr[0] = local_4c;
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i)])","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x2f,"void test_1d_static() [X = 1UL]",dptr + local_4c,&local_4c);
  }
  return;
}

Assistant:

void test_1d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X>, dimensions<1>, dimensions<0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);

    BOOST_TEST_EQ((l.size()), X);
    BOOST_TEST_EQ((l.span()), X);

    int dptr[X];

    // Set all elements to a unique value.
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        BOOST_TEST_EQ(&(dptr[l.index(i)]), &(dptr[i])); 

        dptr[l.index(i)] = i;

        BOOST_TEST_EQ((dptr[l.index(i)]), i); 
    }
}